

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O2

void __thiscall
absl::Flag<int>::Flag(Flag<int> *this,char *name,char *type,char *help,int *default_value)

{
  element_type *peVar1;
  FlagFunc *__p;
  __shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2> _Stack_1d8;
  string local_1c8 [32];
  string local_1a8 [11];
  
  this->_vptr_Flag = (_func_int **)&PTR__Flag_003b6608;
  this->value_ = *default_value;
  __p = (FlagFunc *)operator_new(0x58);
  (__p->default_value)._M_dataplus._M_p = (pointer)&(__p->default_value).field_2;
  (__p->default_value)._M_string_length = 0;
  (__p->default_value).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)&(__p->set_value).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(__p->set_value).super__Function_base._M_functor + 8) = 0;
  (__p->set_value).super__Function_base._M_manager = (_Manager_type)0x0;
  (__p->set_value)._M_invoker = (_Invoker_type)0x0;
  std::__shared_ptr<absl::internal::FlagFunc,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<absl::internal::FlagFunc,void>
            ((__shared_ptr<absl::internal::FlagFunc,(__gnu_cxx::_Lock_policy)2> *)&this->func_,__p);
  peVar1 = (this->func_).super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar1->name = name;
  peVar1->help = help;
  peVar1->type = type;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<(local_1a8,*default_value);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::__cxx11::string::operator=
            ((string *)
             &((this->func_).
               super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              default_value,local_1c8);
  std::__cxx11::string::~string(local_1c8);
  local_1a8[0]._M_dataplus._M_p = (pointer)this;
  std::function<void(std::__cxx11::string_const&)>::operator=
            ((function<void(std::__cxx11::string_const&)> *)
             &((this->func_).
               super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              set_value,(anon_class_8_1_8991fb9c *)local_1a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a8,name,(allocator<char> *)local_1c8);
  std::__shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_1d8,
             &(this->func_).super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>
            );
  internal::RegisterFlag(local_1a8,(shared_ptr<absl::internal::FlagFunc> *)&_Stack_1d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1d8._M_refcount);
  std::__cxx11::string::~string((string *)local_1a8);
  return;
}

Assistant:

Flag<T>::Flag(const char *name, const char *type, const char *help,
              const T &default_value)
    : value_(default_value), func_(new internal::FlagFunc) {
  func_->name = name;
  func_->help = help;
  func_->type = type;
  func_->default_value = internal::to_str<T>(default_value);
  func_->set_value = [this](const std::string &value) {
    this->set_value_as_str(value);
  };
  RegisterFlag(name, func_);
}